

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  undefined1 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  RepeatedField<int> *in_RCX;
  RepeatedField<int> *in_RDX;
  LocationRecorder *in_R9;
  string import_file;
  LocationRecorder weak_location;
  LocationRecorder public_location;
  LocationRecorder location;
  char *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  LocationRecorder *in_stack_fffffffffffffea8;
  LocationRecorder *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  LocationRecorder *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Parser *in_stack_ffffffffffffff28;
  SourceCodeInfo *in_stack_ffffffffffffff30;
  Parser *in_stack_ffffffffffffff38;
  allocator local_b1;
  string local_b0 [80];
  uint local_60;
  LocationRecorder *local_38;
  RepeatedField<int> *local_28;
  RepeatedField<int> *local_20;
  byte local_1;
  
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x609ff1);
  LocationRecorder::LocationRecorder
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
             in_stack_fffffffffffffea0);
  uVar1 = Consume(in_stack_ffffffffffffff28,
                  (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (!(bool)uVar1) {
    local_1 = 0;
    local_60 = 1;
    goto LAB_0060a490;
  }
  bVar2 = LookingAt((Parser *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    in_stack_fffffffffffffe98);
  if (bVar2) {
    RepeatedField<int>::size(local_20);
    LocationRecorder::LocationRecorder
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    bVar2 = Consume(in_stack_ffffffffffffff28,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    in_stack_fffffffffffffefc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffefc);
    if (bVar2) {
      in_stack_fffffffffffffef8 =
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x60a139);
      in_stack_fffffffffffffef0 =
           (string *)
           RepeatedField<int>::Add
                     ((RepeatedField<int> *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      *(int *)in_stack_fffffffffffffef0 = in_stack_fffffffffffffef8;
    }
    else {
      local_1 = 0;
    }
    local_60 = (uint)!bVar2;
    LocationRecorder::~LocationRecorder(in_stack_fffffffffffffeb0);
joined_r0x0060a17f:
    if (local_60 != 0) goto LAB_0060a490;
  }
  else {
    bVar2 = LookingAt((Parser *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      in_stack_fffffffffffffe98);
    in_stack_fffffffffffffeec = CONCAT13(bVar2,(int3)in_stack_fffffffffffffeec);
    if (bVar2) {
      in_stack_fffffffffffffee8 = RepeatedField<int>::size(local_28);
      LocationRecorder::LocationRecorder
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                 in_stack_fffffffffffffea0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"weak",&local_b1);
      LocationRecorder::RecordLegacyImportLocation
                (local_38,(Message *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      bVar2 = Consume(in_stack_ffffffffffffff28,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
      in_stack_fffffffffffffecc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffecc);
      if (bVar2) {
        in_stack_fffffffffffffec8 =
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x60a307);
        in_stack_fffffffffffffec0 =
             (string *)
             RepeatedField<int>::Add
                       ((RepeatedField<int> *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        *(int *)in_stack_fffffffffffffec0 = in_stack_fffffffffffffec8;
        in_stack_fffffffffffffed0 = local_38;
      }
      else {
        local_1 = 0;
        in_stack_fffffffffffffed0 = local_38;
      }
      local_60 = (uint)!bVar2;
      LocationRecorder::~LocationRecorder(in_stack_fffffffffffffeb0);
      goto joined_r0x0060a17f;
    }
  }
  in_stack_fffffffffffffeb0 = (LocationRecorder *)&stack0xffffffffffffff28;
  std::__cxx11::string::string((string *)in_stack_fffffffffffffeb0);
  bVar2 = ConsumeString((Parser *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                        in_stack_fffffffffffffef0,
                        (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (bVar2) {
    this_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x60a3f3);
    std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xffffffffffffff28);
    LocationRecorder::RecordLegacyImportLocation
              (in_stack_fffffffffffffed0,
               (Message *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    bVar2 = ConsumeEndOfDeclaration
                      (in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                       (LocationRecorder *)in_stack_ffffffffffffff28);
    if (bVar2) {
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  local_60 = 1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
LAB_0060a490:
  LocationRecorder::~LocationRecorder(in_stack_fffffffffffffeb0);
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<std::string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  LocationRecorder location(root_location,
                            FileDescriptorProto::kDependencyFieldNumber,
                            dependency->size());

  DO(Consume("import"));

  if (LookingAt("public")) {
    LocationRecorder public_location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder weak_location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    weak_location.RecordLegacyImportLocation(containing_file, "weak");
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }

  string import_file;
  DO(ConsumeString(&import_file,
                   "Expected a string naming the file to import."));
  *dependency->Add() = import_file;
  location.RecordLegacyImportLocation(containing_file, import_file);

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}